

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void av1_prune_ab_partitions
               (AV1_COMP *cpi,MACROBLOCK *x,PC_TREE *pc_tree,int pb_source_variance,
               int64_t best_rdcost,RD_RECT_PART_WIN_INFO *rect_part_win_info,
               _Bool ext_partition_allowed,PartitionSearchState *part_state,
               int *ab_partitions_allowed)

{
  ExtPartController *ext_part_controller;
  PARTITION_TYPE PVar1;
  BLOCK_SIZE BVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  NN_CONFIG *pNVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  float features [10];
  int sub_block_rdcost [8];
  int int_score [16];
  float score [16];
  int in_stack_ffffffffffffd418;
  float local_2bc8;
  float fStack_2bc4;
  float fStack_2bc0;
  uint uStack_2bbc;
  float local_2bb8 [4];
  float local_2ba8 [4];
  uint local_2b98 [8];
  aom_partition_features_t local_2b78;
  aom_partition_decision_t local_2078;
  
  uVar13 = 0;
  uVar9 = 0;
  if ((ext_partition_allowed) && ((cpi->oxcf).part_cfg.enable_ab_partitions == true)) {
    uVar9 = (uint)(part_state->partition_rect_allowed[0] != 0);
  }
  if ((ext_partition_allowed) && ((cpi->oxcf).part_cfg.enable_ab_partitions == true)) {
    uVar13 = (uint)(part_state->partition_rect_allowed[1] != 0);
  }
  iVar5 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  if (iVar5 != 0) {
    if (iVar5 == 1) {
      PVar1 = pc_tree->partitioning;
      uVar14 = 1;
      uVar11 = 1;
      if ((PVar1 != '\x01') && (0x1f < pb_source_variance || PVar1 != '\0')) {
        uVar11 = (uint)(PVar1 == '\x03');
      }
      if ((PVar1 != '\x02') && (0x1f < pb_source_variance || PVar1 != '\0')) {
        uVar14 = (uint)(PVar1 == '\x03');
      }
    }
    else {
      PVar1 = pc_tree->partitioning;
      uVar14 = (uint)(PVar1 == '\x03');
      uVar11 = uVar14;
      if (PVar1 == '\x01') {
        uVar11 = 1;
      }
      if (PVar1 == '\x02') {
        uVar14 = 1;
      }
    }
    uVar9 = uVar9 & uVar11;
    uVar13 = uVar13 & uVar14;
    lVar7 = part_state->rect_part_rd[0][0];
    lVar12 = 0;
    if (lVar7 == 0x7fffffffffffffff) {
      lVar7 = lVar12;
    }
    part_state->rect_part_rd[0][0] = lVar7;
    lVar7 = part_state->rect_part_rd[0][1];
    if (lVar7 == 0x7fffffffffffffff) {
      lVar7 = lVar12;
    }
    part_state->rect_part_rd[0][1] = lVar7;
    lVar7 = part_state->rect_part_rd[1][0];
    if (lVar7 == 0x7fffffffffffffff) {
      lVar7 = lVar12;
    }
    part_state->rect_part_rd[1][0] = lVar7;
    lVar7 = part_state->rect_part_rd[1][1];
    if (lVar7 == 0x7fffffffffffffff) {
      lVar7 = lVar12;
    }
    part_state->rect_part_rd[1][1] = lVar7;
    lVar7 = part_state->split_rd[0];
    if (part_state->split_rd[0] == 0x7fffffffffffffff) {
      lVar7 = lVar12;
    }
    lVar8 = part_state->split_rd[1];
    if (part_state->split_rd[1] == 0x7fffffffffffffff) {
      lVar8 = lVar12;
    }
    part_state->split_rd[0] = lVar7;
    part_state->split_rd[1] = lVar8;
    lVar7 = part_state->split_rd[2];
    if (part_state->split_rd[2] == 0x7fffffffffffffff) {
      lVar7 = lVar12;
    }
    part_state->split_rd[2] = lVar7;
    lVar7 = part_state->split_rd[3];
    if (part_state->split_rd[3] == 0x7fffffffffffffff) {
      lVar7 = lVar12;
    }
    part_state->split_rd[3] = lVar7;
  }
  *ab_partitions_allowed = uVar9;
  ab_partitions_allowed[1] = uVar9;
  iVar5 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  if (iVar5 != 0) {
    lVar12 = part_state->split_rd[0] + part_state->rect_part_rd[0][1];
    lVar7 = lVar12 + part_state->split_rd[1];
    lVar8 = part_state->split_rd[2] + part_state->rect_part_rd[0][0];
    lVar12 = part_state->split_rd[1] + lVar12 + 0xf;
    if (-1 < lVar7) {
      lVar12 = lVar7;
    }
    lVar7 = part_state->split_rd[3] + lVar8;
    lVar8 = part_state->split_rd[3] + lVar8 + 0xf;
    if (-1 < lVar7) {
      lVar8 = lVar7;
    }
    uVar6 = (ulong)(iVar5 == 1) ^ 0xf;
    *ab_partitions_allowed = (long)((lVar12 >> 4) * uVar6) < best_rdcost & uVar9;
    ab_partitions_allowed[1] = (long)(uVar6 * (lVar8 >> 4)) < best_rdcost & uVar9;
  }
  ab_partitions_allowed[2] = uVar13;
  ab_partitions_allowed[3] = uVar13;
  iVar5 = (cpi->sf).part_sf.prune_ext_partition_types_search_level;
  if (iVar5 != 0) {
    lVar12 = part_state->split_rd[0] + part_state->rect_part_rd[1][1];
    lVar7 = lVar12 + part_state->split_rd[2];
    lVar8 = part_state->split_rd[1] + part_state->rect_part_rd[1][0];
    lVar12 = part_state->split_rd[2] + lVar12 + 0xf;
    if (-1 < lVar7) {
      lVar12 = lVar7;
    }
    lVar7 = lVar8 + part_state->split_rd[3];
    lVar8 = lVar8 + part_state->split_rd[3] + 0xf;
    if (-1 < lVar7) {
      lVar8 = lVar7;
    }
    uVar6 = (ulong)(iVar5 == 1) ^ 0xf;
    ab_partitions_allowed[2] = (long)((lVar12 >> 4) * uVar6) < best_rdcost & uVar13;
    ab_partitions_allowed[3] = (long)(uVar6 * (lVar8 >> 4)) < best_rdcost & uVar13;
  }
  if (((!ext_partition_allowed || (cpi->sf).part_sf.ml_prune_partition == 0) ||
      (part_state->partition_rect_allowed[0] == 0)) || (part_state->partition_rect_allowed[1] == 0))
  goto LAB_001fdf6e;
  uVar9 = x->source_variance;
  uVar13 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  iVar5 = (uVar13 ^ 0xffffffe0) + 0x21;
  if (uVar9 == 0) {
    iVar5 = 0;
  }
  BVar2 = (part_state->part_blk_params).bsize;
  if (999999999 < best_rdcost || BVar2 < BLOCK_8X8) goto LAB_001fdf6e;
  bVar3 = true;
  pNVar10 = (NN_CONFIG *)0x0;
  switch(BVar2) {
  case BLOCK_16X16:
    pNVar10 = &av1_ab_partition_nnconfig_16;
    break;
  default:
    goto switchD_001fdc31_caseD_7;
  case BLOCK_32X32:
    pNVar10 = &av1_ab_partition_nnconfig_32;
    break;
  case BLOCK_64X64:
    pNVar10 = &av1_ab_partition_nnconfig_64;
    break;
  case BLOCK_128X128:
    pNVar10 = &av1_ab_partition_nnconfig_128;
  }
  bVar3 = false;
switchD_001fdc31_caseD_7:
  if (!bVar3) {
    local_2bc8 = (float)pc_tree->partitioning;
    fStack_2bc4 = (float)iVar5;
    local_2b98[4] = 0;
    local_2b98[5] = 0;
    local_2b98[6] = 0;
    local_2b98[7] = 0;
    local_2b98[0] = 0;
    local_2b98[1] = 0;
    local_2b98[2] = 0;
    local_2b98[3] = 0;
    lVar7 = 0;
    do {
      lVar12 = part_state->rect_part_rd[0][lVar7];
      if (lVar12 - 1U < 999999999) {
        local_2b98[lVar7] = (uint)lVar12;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    lVar7 = 0;
    do {
      lVar12 = part_state->rect_part_rd[1][lVar7];
      if (lVar12 - 1U < 999999999) {
        local_2b98[lVar7 + 2] = (uint)lVar12;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 == 1);
    lVar7 = 0;
    do {
      if (part_state->split_rd[lVar7] - 1U < 999999999) {
        local_2b98[lVar7 + 4] = (uint)part_state->split_rd[lVar7];
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    iVar5 = (int)best_rdcost;
    auVar15._0_4_ = (float)iVar5;
    auVar15._4_4_ = auVar15._0_4_;
    auVar15._8_4_ = auVar15._0_4_;
    auVar15._12_4_ = auVar15._0_4_;
    lVar7 = 0;
    do {
      uVar9 = local_2b98[lVar7];
      uVar13 = local_2b98[lVar7 + 1];
      uVar11 = local_2b98[lVar7 + 2];
      uVar14 = local_2b98[lVar7 + 3];
      uVar21 = -(uint)((int)uVar9 < iVar5 && 0 < (int)uVar9);
      uVar22 = -(uint)((int)uVar13 < iVar5 && 0 < (int)uVar13);
      uVar23 = -(uint)((int)uVar11 < iVar5 && 0 < (int)uVar11);
      uVar24 = -(uint)((int)uVar14 < iVar5 && 0 < (int)uVar14);
      auVar20._0_4_ =
           ((float)(uVar9 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar9 & 0xffff | 0x4b000000);
      auVar20._4_4_ =
           ((float)(uVar13 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar13 & 0xffff | 0x4b000000);
      auVar20._8_4_ =
           ((float)(uVar11 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar11 & 0xffff | 0x4b000000);
      auVar20._12_4_ =
           ((float)(uVar14 >> 0x10 | 0x53000000) - 5.497642e+11) +
           (float)(uVar14 & 0xffff | 0x4b000000);
      auVar20 = divps(auVar20,auVar15);
      (&fStack_2bc0)[lVar7] = (float)(~uVar21 & 0x3f800000 | auVar20._0_4_ & uVar21);
      (&uStack_2bbc)[lVar7] = ~uVar22 & 0x3f800000 | auVar20._4_4_ & uVar22;
      local_2bb8[lVar7] = (float)(~uVar23 & 0x3f800000 | auVar20._8_4_ & uVar23);
      local_2bb8[lVar7 + 1] = (float)(~uVar24 & 0x3f800000 | auVar20._12_4_ & uVar24);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 8);
    if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
      write_features_to_file
                ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,
                 &local_2bc8,10,6,(BLOCK_SIZE)pNVar10,in_stack_ffffffffffffd418,(int)pNVar10);
    }
    if ((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
       (ext_part_controller = &cpi->ext_part_controller, ext_part_controller->ready != 0)) {
      local_2b78.id = AOM_EXT_PART_FEATURE_AFTER_RECT;
      local_2b78.after_part_rect.f[1] = fStack_2bc4;
      local_2b78.after_part_rect.f[0] = local_2bc8;
      local_2b78.after_part_rect.f[2] = fStack_2bc0;
      local_2b78.after_part_rect.f[3] = (float)uStack_2bbc;
      local_2b78.after_part_rect.f[4] = local_2bb8[0];
      local_2b78.after_part_rect.f[5] = local_2bb8[1];
      local_2b78.after_part_rect.f[6] = local_2bb8[2];
      local_2b78.after_part_rect.f[7] = local_2bb8[3];
      local_2b78.after_part_rect.f[8] = local_2ba8[0];
      local_2b78.after_part_rect.f[9] = local_2ba8[1];
      av1_ext_part_send_features(ext_part_controller,&local_2b78);
      _Var4 = av1_ext_part_get_partition_decision(ext_part_controller,&local_2078);
      if (_Var4) {
        ab_partitions_allowed[0] = local_2078.horza_partition_allowed;
        ab_partitions_allowed[1] = local_2078.horzb_partition_allowed;
        ab_partitions_allowed[2] = local_2078.verta_partition_allowed;
        ab_partitions_allowed[3] = local_2078.vertb_partition_allowed;
        goto LAB_001fdf6e;
      }
    }
    local_2078.partition_decision[10] = 0;
    local_2078.partition_decision[0xb] = 0;
    local_2078.partition_decision[0xc] = 0;
    local_2078.partition_decision[0xd] = 0;
    local_2078.partition_decision[6] = 0;
    local_2078.partition_decision[7] = 0;
    local_2078.partition_decision[8] = 0;
    local_2078.partition_decision[9] = 0;
    local_2078.partition_decision[2] = 0;
    local_2078.partition_decision[3] = 0;
    local_2078.partition_decision[4] = 0;
    local_2078.partition_decision[5] = 0;
    local_2078.is_final_decision = 0;
    local_2078.num_nodes = 0;
    local_2078.partition_decision[0] = 0;
    local_2078.partition_decision[1] = 0;
    (*av1_nn_predict)(&local_2bc8,pNVar10,1,(float *)&local_2078);
    uVar9 = 0xfffffc18;
    uVar13 = 0xfffffc18;
    uVar11 = 0xfffffc18;
    uVar14 = 0xfffffc18;
    lVar7 = 0;
    do {
      fVar16 = (float)(int)((float)local_2078.partition_decision[lVar7 + -2] * 100.0);
      fVar17 = (float)(int)((float)local_2078.partition_decision[lVar7 + -1] * 100.0);
      fVar18 = (float)(int)((float)local_2078.partition_decision[lVar7] * 100.0);
      fVar19 = (float)(int)((float)local_2078.partition_decision[lVar7 + 1] * 100.0);
      local_2b78.before_part_none.f[lVar7 + -1] = fVar16;
      local_2b78.before_part_none.f[lVar7] = fVar17;
      local_2b78.before_part_none.f[lVar7 + 1] = fVar18;
      local_2b78.before_part_none.f[lVar7 + 2] = fVar19;
      uVar9 = ~-(uint)((int)fVar16 < (int)uVar9) & (uint)fVar16 |
              uVar9 & -(uint)((int)fVar16 < (int)uVar9);
      uVar13 = ~-(uint)((int)fVar17 < (int)uVar13) & (uint)fVar17 |
               uVar13 & -(uint)((int)fVar17 < (int)uVar13);
      uVar11 = ~-(uint)((int)fVar18 < (int)uVar11) & (uint)fVar18 |
               uVar11 & -(uint)((int)fVar18 < (int)uVar11);
      uVar14 = ~-(uint)((int)fVar19 < (int)uVar14) & (uint)fVar19 |
               uVar14 & -(uint)((int)fVar19 < (int)uVar14);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x10);
    uVar11 = ~-(uint)((int)uVar11 < (int)uVar9) & uVar11 | uVar9 & -(uint)((int)uVar11 < (int)uVar9)
    ;
    uVar13 = ~-(uint)((int)uVar14 < (int)uVar13) & uVar14 |
             uVar13 & -(uint)((int)uVar14 < (int)uVar13);
    uVar9 = -(uint)((int)uVar13 < (int)uVar11);
    uVar9 = ~uVar9 & uVar13 | uVar11 & uVar9;
    if (BVar2 == BLOCK_32X32) {
      uVar9 = uVar9 - 100;
    }
    else if (BVar2 == BLOCK_16X16) {
      uVar9 = uVar9 - 0x96;
    }
    ab_partitions_allowed[0] = 0;
    ab_partitions_allowed[1] = 0;
    ab_partitions_allowed[2] = 0;
    ab_partitions_allowed[3] = 0;
    uVar6 = 0;
    do {
      if ((int)uVar9 <= (int)local_2b78.before_part_none.f[uVar6 - 1]) {
        if ((uVar6 & 1) != 0) {
          *ab_partitions_allowed = 1;
        }
        if ((uVar6 & 2) != 0) {
          ab_partitions_allowed[1] = 1;
        }
        if ((uVar6 & 4) != 0) {
          ab_partitions_allowed[2] = 1;
        }
        if (7 < uVar6) {
          ab_partitions_allowed[3] = 1;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x10);
  }
LAB_001fdf6e:
  if ((1 < (cpi->sf).part_sf.prune_ext_part_using_split_info) &&
     (uVar9 = *ab_partitions_allowed, uVar9 != 0)) {
    uVar13 = evaluate_ab_partition_based_on_split(pc_tree,'\x01',rect_part_win_info,x->qindex,0,1);
    *ab_partitions_allowed = uVar13 & uVar9;
  }
  if ((1 < (cpi->sf).part_sf.prune_ext_part_using_split_info) &&
     (uVar9 = ab_partitions_allowed[1], uVar9 != 0)) {
    uVar13 = evaluate_ab_partition_based_on_split(pc_tree,'\x01',rect_part_win_info,x->qindex,2,3);
    ab_partitions_allowed[1] = uVar13 & uVar9;
  }
  if ((1 < (cpi->sf).part_sf.prune_ext_part_using_split_info) &&
     (uVar9 = ab_partitions_allowed[2], uVar9 != 0)) {
    uVar13 = evaluate_ab_partition_based_on_split(pc_tree,'\x02',rect_part_win_info,x->qindex,0,2);
    ab_partitions_allowed[2] = uVar13 & uVar9;
  }
  if ((1 < (cpi->sf).part_sf.prune_ext_part_using_split_info) &&
     (uVar9 = ab_partitions_allowed[3], uVar9 != 0)) {
    uVar13 = evaluate_ab_partition_based_on_split(pc_tree,'\x02',rect_part_win_info,x->qindex,1,3);
    ab_partitions_allowed[3] = uVar13 & uVar9;
  }
  return;
}

Assistant:

void av1_prune_ab_partitions(AV1_COMP *cpi, const MACROBLOCK *x,
                             const PC_TREE *pc_tree, int pb_source_variance,
                             int64_t best_rdcost,
                             const RD_RECT_PART_WIN_INFO *rect_part_win_info,
                             bool ext_partition_allowed,
                             PartitionSearchState *part_state,
                             int *ab_partitions_allowed) {
  int64_t *horz_rd = part_state->rect_part_rd[HORZ];
  int64_t *vert_rd = part_state->rect_part_rd[VERT];
  int64_t *split_rd = part_state->split_rd;
  const PartitionCfg *const part_cfg = &cpi->oxcf.part_cfg;
  // The standard AB partitions are allowed initially if ext-partition-types are
  // allowed.
  int horzab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[HORZ];
  int vertab_partition_allowed = ext_partition_allowed &&
                                 part_cfg->enable_ab_partitions &&
                                 part_state->partition_rect_allowed[VERT];

  // Pruning: pruning out AB partitions on one main direction based on the
  // current best partition and source variance.
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    if (cpi->sf.part_sf.prune_ext_partition_types_search_level == 1) {
      // TODO(debargha,huisu@google.com): may need to tune the threshold for
      // pb_source_variance.
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   (pc_tree->partitioning == PARTITION_NONE &&
                                    pb_source_variance < 32) ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    } else {
      horzab_partition_allowed &= (pc_tree->partitioning == PARTITION_HORZ ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
      vertab_partition_allowed &= (pc_tree->partitioning == PARTITION_VERT ||
                                   pc_tree->partitioning == PARTITION_SPLIT);
    }
    horz_rd[0] = (horz_rd[0] < INT64_MAX ? horz_rd[0] : 0);
    horz_rd[1] = (horz_rd[1] < INT64_MAX ? horz_rd[1] : 0);
    vert_rd[0] = (vert_rd[0] < INT64_MAX ? vert_rd[0] : 0);
    vert_rd[1] = (vert_rd[1] < INT64_MAX ? vert_rd[1] : 0);
    split_rd[0] = (split_rd[0] < INT64_MAX ? split_rd[0] : 0);
    split_rd[1] = (split_rd[1] < INT64_MAX ? split_rd[1] : 0);
    split_rd[2] = (split_rd[2] < INT64_MAX ? split_rd[2] : 0);
    split_rd[3] = (split_rd[3] < INT64_MAX ? split_rd[3] : 0);
  }

  // Pruning: pruning out horz_a or horz_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[HORZ_A] = horzab_partition_allowed;
  ab_partitions_allowed[HORZ_B] = horzab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t horz_a_rd = horz_rd[1] + split_rd[0] + split_rd[1];
    const int64_t horz_b_rd = horz_rd[0] + split_rd[2] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[HORZ_A] &= (horz_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[HORZ_B] &= (horz_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out vert_a or vert_b if the combined rdcost of its
  // subblocks estimated from previous partitions is much higher than the best
  // rd so far.
  ab_partitions_allowed[VERT_A] = vertab_partition_allowed;
  ab_partitions_allowed[VERT_B] = vertab_partition_allowed;
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
    const int64_t vert_a_rd = vert_rd[1] + split_rd[0] + split_rd[2];
    const int64_t vert_b_rd = vert_rd[0] + split_rd[1] + split_rd[3];
    switch (cpi->sf.part_sf.prune_ext_partition_types_search_level) {
      case 1:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 14 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 14 < best_rdcost);
        break;
      case 2:
      default:
        ab_partitions_allowed[VERT_A] &= (vert_a_rd / 16 * 15 < best_rdcost);
        ab_partitions_allowed[VERT_B] &= (vert_b_rd / 16 * 15 < best_rdcost);
        break;
    }
  }

  // Pruning: pruning out some ab partitions using a DNN taking rd costs of
  // sub-blocks from previous basic partition types.
  if (cpi->sf.part_sf.ml_prune_partition && ext_partition_allowed &&
      part_state->partition_rect_allowed[HORZ] &&
      part_state->partition_rect_allowed[VERT]) {
    // TODO(huisu@google.com): x->source_variance may not be the current
    // block's variance. The correct one to use is pb_source_variance. Need to
    // re-train the model to fix it.
    ml_prune_ab_partition(cpi, pc_tree->partitioning,
                          get_unsigned_bits(x->source_variance), best_rdcost,
                          part_state, ab_partitions_allowed);
  }

  // Pruning: pruning AB partitions based on the number of horz/vert wins
  // in the current block and sub-blocks in PARTITION_SPLIT.
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_A]) {
    ab_partitions_allowed[HORZ_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 0, 1);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[HORZ_B]) {
    ab_partitions_allowed[HORZ_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_HORZ, rect_part_win_info, x->qindex, 2, 3);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_A]) {
    ab_partitions_allowed[VERT_A] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 0, 2);
  }
  if (cpi->sf.part_sf.prune_ext_part_using_split_info >= 2 &&
      ab_partitions_allowed[VERT_B]) {
    ab_partitions_allowed[VERT_B] &= evaluate_ab_partition_based_on_split(
        pc_tree, PARTITION_VERT, rect_part_win_info, x->qindex, 1, 3);
  }
}